

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O0

uint8_vec * __thiscall crnlib::ktx_texture::find_key(ktx_texture *this,char *pKey)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  vector<unsigned_char> *this_00;
  uchar *__s1;
  uint8_vec *v;
  uint i;
  size_t n;
  char *pKey_local;
  ktx_texture *this_local;
  
  sVar3 = strlen(pKey);
  v._4_4_ = 0;
  do {
    uVar1 = vector<crnlib::vector<unsigned_char>_>::size(&this->m_key_values);
    if (uVar1 <= v._4_4_) {
      return (uint8_vec *)0x0;
    }
    this_00 = vector<crnlib::vector<unsigned_char>_>::operator[](&this->m_key_values,v._4_4_);
    uVar1 = vector<unsigned_char>::size(this_00);
    if (sVar3 + 1 <= (ulong)uVar1) {
      __s1 = vector<unsigned_char>::operator[](this_00,0);
      iVar2 = memcmp(__s1,pKey,sVar3 + 1);
      if (iVar2 == 0) {
        return this_00;
      }
    }
    v._4_4_ = v._4_4_ + 1;
  } while( true );
}

Assistant:

const uint8_vec* ktx_texture::find_key(const char* pKey) const
    {
        const size_t n = strlen(pKey) + 1;
        for (uint i = 0; i < m_key_values.size(); i++)
        {
            const uint8_vec& v = m_key_values[i];
            if ((v.size() >= n) && (!memcmp(&v[0], pKey, n)))
            {
                return &v;
            }
        }

        return nullptr;
    }